

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O3

char * ngram_type_to_str(int type)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = (char *)0x0;
  if (type == 2) {
    pcVar2 = "dmp/bin";
  }
  pcVar1 = "arpa";
  if (type != 1) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

char const *
ngram_type_to_str(int type)
{
    switch (type) {
    case NGRAM_ARPA:
        return "arpa";
    case NGRAM_BIN:
        return "dmp/bin";
    default:
        return NULL;
    }
}